

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_bin
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  uint uVar2;
  format_specs *pfVar3;
  ulong uVar4;
  ulong uVar5;
  bin_writer<1> f;
  int num_digits;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  string_view prefix;
  undefined4 uStack_34;
  undefined8 uStack_30;
  
  pfVar3 = this->specs;
  if ((char)pfVar3->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = pfVar3->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  num_digits = 0;
  uVar6 = *(ulong *)((long)&this->abs_value + 8);
  uVar7 = (ulong)this->abs_value;
  do {
    uVar4 = uVar6 << 0x3f;
    num_digits = num_digits + 1;
    bVar8 = 1 < uVar7;
    bVar9 = uVar6 != 0;
    uVar5 = -uVar6;
    uVar6 = uVar6 >> 1;
    uVar7 = uVar4 | uVar7 >> 1;
  } while (bVar9 || uVar5 < bVar8);
  prefix.data_ = this->prefix;
  f._20_4_ = uStack_34;
  f.num_digits = num_digits;
  f.abs_value = this->abs_value;
  f._24_8_ = uStack_30;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<1>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,num_digits,prefix,*pfVar3,
             f);
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }